

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O3

void __thiscall t_py_generator::generate_enum(t_py_generator *this,t_enum *tenum)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  long *plVar5;
  size_type *psVar6;
  char *pcVar7;
  pointer pptVar8;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  ostringstream from_string_mapping;
  ostringstream to_string_mapping;
  char local_3c1;
  string local_3c0;
  ofstream_with_content_based_conditional_update *local_3a0;
  string local_398;
  char local_378;
  undefined7 uStack_377;
  long local_370;
  undefined1 local_368 [16];
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  local_3a0 = &this->f_types_;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_3a0,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"class ",6);
  iVar3 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)CONCAT44(extraout_var,iVar3),
                      ((undefined8 *)CONCAT44(extraout_var,iVar3))[1]);
  pcVar7 = "";
  if (this->gen_newstyle_ != false) {
    pcVar7 = "(object)";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,(ulong)this->gen_newstyle_ << 3);
  bVar2 = this->gen_dynamic_;
  if (bVar2 == true) {
    std::operator+(&local_340,"(",&this->gen_dynbaseclass_);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_340);
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_3c0.field_2._M_allocated_capacity = *psVar6;
      local_3c0.field_2._8_8_ = plVar5[3];
    }
    else {
      local_3c0.field_2._M_allocated_capacity = *psVar6;
      local_3c0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_3c0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  else {
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"");
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  if ((bVar2 != false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2)) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  generate_python_docstring(this,(ostream *)local_3a0,(t_doc *)tenum);
  t_generator::indent_abi_cxx11_(&local_3c0,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_VALUES_TO_NAMES = {",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_3c0,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_320,local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_NAMES_TO_VALUES = {",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            (&local_358,&tenum->constants_);
  if (local_358.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_358.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar8 = local_358.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      iVar3 = (*pptVar8)->value_;
      poVar4 = t_generator::indent(&this->super_t_generator,(ostream *)local_3a0);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,((*pptVar8)->name_)._M_dataplus._M_p,
                          ((*pptVar8)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_3c0,&this->super_t_generator);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_3c0._M_dataplus._M_p,local_3c0._M_string_length
                         );
      t_generator::indent_abi_cxx11_(&local_398,&this->super_t_generator);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_398._M_dataplus._M_p,local_398._M_string_length);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": \"",3);
      (*(this->super_t_generator)._vptr_t_generator[3])(&local_378,this,&(*pptVar8)->name_);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)CONCAT71(uStack_377,local_378),local_370);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\",",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((undefined1 *)CONCAT71(uStack_377,local_378) != local_368) {
        operator_delete((undefined1 *)CONCAT71(uStack_377,local_378));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_3c0,&this->super_t_generator);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_320,local_3c0._M_dataplus._M_p,local_3c0._M_string_length
                         );
      t_generator::indent_abi_cxx11_(&local_398,&this->super_t_generator);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_398._M_dataplus._M_p,local_398._M_string_length);
      local_378 = '\"';
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_378,1);
      (*(this->super_t_generator)._vptr_t_generator[3])(&local_378,this,&(*pptVar8)->name_);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)CONCAT71(uStack_377,local_378),local_370);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\": ",3);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      local_3c1 = ',';
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_3c1,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((undefined1 *)CONCAT71(uStack_377,local_378) != local_368) {
        operator_delete((undefined1 *)CONCAT71(uStack_377,local_378));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p);
      }
      pptVar8 = pptVar8 + 1;
    } while (pptVar8 !=
             local_358.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  t_generator::indent_abi_cxx11_(&local_3c0,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_3c0,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_320,local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3a0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  std::__cxx11::stringbuf::str();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_3a0,local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,local_398._M_dataplus._M_p,local_398._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  if (local_358.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_358.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void t_py_generator::generate_enum(t_enum* tenum) {
  std::ostringstream to_string_mapping, from_string_mapping;

  f_types_ << endl << endl << "class " << tenum->get_name() << (gen_newstyle_ ? "(object)" : "")
           << (gen_dynamic_ ? "(" + gen_dynbaseclass_ + ")" : "") << ":" << endl;
  indent_up();
  generate_python_docstring(f_types_, tenum);

  to_string_mapping << indent() << "_VALUES_TO_NAMES = {" << endl;
  from_string_mapping << indent() << "_NAMES_TO_VALUES = {" << endl;

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    int value = (*c_iter)->get_value();
    indent(f_types_) << (*c_iter)->get_name() << " = " << value << endl;

    // Dictionaries to/from string names of enums
    to_string_mapping << indent() << indent() << value << ": \""
                      << escape_string((*c_iter)->get_name()) << "\"," << endl;
    from_string_mapping << indent() << indent() << '"' << escape_string((*c_iter)->get_name())
                        << "\": " << value << ',' << endl;
  }
  to_string_mapping << indent() << "}" << endl;
  from_string_mapping << indent() << "}" << endl;

  indent_down();
  f_types_ << endl;
  f_types_ << to_string_mapping.str() << endl << from_string_mapping.str();
}